

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  pointer pIVar2;
  pointer puVar3;
  bool run_on_debug_line_insts_00;
  char cVar4;
  undefined7 in_register_00000011;
  Instruction *dbg_line;
  pointer pIVar5;
  Instruction *pIVar6;
  pointer pIVar7;
  Instruction *i_12;
  Instruction *dbg_line_3;
  Instruction *i;
  Instruction *pIVar8;
  pointer puVar9;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_70;
  function<void_(const_spvtools::opt::Instruction_*)> *local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  Instruction *local_48;
  pointer local_40;
  Module *local_38;
  
  local_40 = (pointer)CONCAT44(local_40._4_4_,
                               (int)CONCAT71(in_register_00000011,run_on_debug_line_insts));
  local_48 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_38 = this;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar5 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar7 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar5 != pIVar7) {
          do {
            local_70._M_head_impl = pIVar5;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_0025fae9;
            pIVar5 = pIVar5 + 1;
          } while (pIVar5 != pIVar7);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_0025fae9:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_0025fbd6;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_0025fbd6:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_;
  pIVar8 = (local_38->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_0025fcc3;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_0025fcc3:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  pIVar5 = (local_38->memory_model_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar5 != (pointer)0x0) {
    local_60 = 0;
    local_50 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
               ::_M_manager;
    local_68 = f;
    if ((char)local_40 != '\0') {
      pIVar7 = (pIVar5->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = *(pointer *)
                ((long)&(pIVar5->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar7 != pIVar2) {
        do {
          local_70._M_head_impl = pIVar7;
          if (local_58 == (code *)0x0) goto LAB_00260704;
          cVar4 = (*local_50)(&local_68,&local_70);
          if (cVar4 == '\0') goto LAB_0025fd9a;
          pIVar7 = pIVar7 + 1;
        } while (pIVar7 != pIVar2);
        local_70._M_head_impl = pIVar5;
        if (local_58 == (code *)0x0) goto LAB_00260704;
      }
    }
    local_70._M_head_impl = pIVar5;
    (*local_50)(&local_68,&local_70);
LAB_0025fd9a:
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  pIVar5 = (local_38->sampled_image_address_mode_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar5 != (pointer)0x0) {
    local_60 = 0;
    local_50 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
               ::_M_manager;
    local_68 = f;
    if ((char)local_40 != '\0') {
      pIVar7 = (pIVar5->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = *(pointer *)
                ((long)&(pIVar5->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      if (pIVar7 != pIVar2) {
        do {
          local_70._M_head_impl = pIVar7;
          if (local_58 == (code *)0x0) goto LAB_00260704;
          cVar4 = (*local_50)(&local_68,&local_70);
          if (cVar4 == '\0') goto LAB_0025fe5d;
          pIVar7 = pIVar7 + 1;
        } while (pIVar7 != pIVar2);
        local_70._M_head_impl = pIVar5;
        if (local_58 == (code *)0x0) {
LAB_00260704:
          std::__throw_bad_function_call();
        }
      }
    }
    local_70._M_head_impl = pIVar5;
    (*local_50)(&local_68,&local_70);
LAB_0025fe5d:
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  local_48 = &(local_38->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_0025ff36;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_0025ff36:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
  ;
  pIVar8 = (local_38->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_00260023;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_00260023:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_00260110;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_00260110:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_002601fd;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_002601fd:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_002602ea;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_002602ea:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_002603d7;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_002603d7:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar8 = (local_38->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar8 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar6 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (pIVar8->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar6 != pIVar1) {
          do {
            local_70._M_head_impl = pIVar6;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_002604c4;
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != pIVar1);
          local_70._M_head_impl = pIVar8;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar8;
      (*local_50)(&local_68,&local_70);
LAB_002604c4:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar8 != local_48);
  }
  local_48 = &(local_38->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
              sentinel_;
  pIVar5 = (local_38->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
           .super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar5 != local_48) {
    do {
      local_60 = 0;
      local_50 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                 ::_M_manager;
      local_68 = f;
      if ((char)local_40 != '\0') {
        pIVar7 = (pIVar5->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (pIVar5->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar7 != pIVar2) {
          do {
            local_70._M_head_impl = pIVar7;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_002605b1;
            pIVar7 = pIVar7 + 1;
          } while (pIVar7 != pIVar2);
          local_70._M_head_impl = pIVar5;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
      }
      local_70._M_head_impl = pIVar5;
      (*local_50)(&local_68,&local_70);
LAB_002605b1:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      pIVar5 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar5 != local_48);
  }
  puVar9 = (local_38->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_38->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar3) {
    run_on_debug_line_insts_00 = (bool)(char)local_40;
    do {
      Function::ForEachInst
                ((puVar9->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                 .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,f,
                 run_on_debug_line_insts_00,true);
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
  }
  if ((char)local_40 != '\0') {
    pIVar5 = (local_38->trailing_dbg_line_info_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (local_38->trailing_dbg_line_info_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar5 != local_40) {
      do {
        local_60 = 0;
        local_50 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_invoke;
        local_58 = std::
                   _Function_handler<bool_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:791:7)>
                   ::_M_manager;
        pIVar7 = (pIVar5->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (pIVar5->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_68 = f;
        if (pIVar7 != pIVar2) {
          do {
            local_70._M_head_impl = pIVar7;
            if (local_58 == (code *)0x0) goto LAB_00260704;
            cVar4 = (*local_50)(&local_68,&local_70);
            if (cVar4 == '\0') goto LAB_002606cf;
            pIVar7 = pIVar7 + 1;
          } while (pIVar7 != pIVar2);
          local_70._M_head_impl = pIVar5;
          if (local_58 == (code *)0x0) goto LAB_00260704;
        }
        local_70._M_head_impl = pIVar5;
        (*local_50)(&local_68,&local_70);
LAB_002606cf:
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
        pIVar5 = pIVar5 + 1;
      } while (pIVar5 != local_40);
    }
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(const Instruction*)>& f,
                         bool run_on_debug_line_insts) const {
#define DELEGATE(i) i.ForEachInst(f, run_on_debug_line_insts)
  for (auto& i : capabilities_) DELEGATE(i);
  for (auto& i : extensions_) DELEGATE(i);
  for (auto& i : ext_inst_imports_) DELEGATE(i);
  if (memory_model_)
    static_cast<const Instruction*>(memory_model_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    static_cast<const Instruction*>(sampled_image_address_mode_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  for (auto& i : entry_points_) DELEGATE(i);
  for (auto& i : execution_modes_) DELEGATE(i);
  for (auto& i : debugs1_) DELEGATE(i);
  for (auto& i : debugs2_) DELEGATE(i);
  for (auto& i : debugs3_) DELEGATE(i);
  for (auto& i : annotations_) DELEGATE(i);
  for (auto& i : types_values_) DELEGATE(i);
  for (auto& i : ext_inst_debuginfo_) DELEGATE(i);
  for (auto& i : functions_) {
    static_cast<const Function*>(i.get())->ForEachInst(
        f, run_on_debug_line_insts,
        /* run_on_non_semantic_insts = */ true);
  }
  if (run_on_debug_line_insts) {
    for (auto& i : trailing_dbg_line_info_) DELEGATE(i);
  }
#undef DELEGATE
}